

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImGuiListClipperRange * __thiscall
ImVector<ImGuiListClipperRange>::insert
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *it,ImGuiListClipperRange *v)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int new_capacity;
  ImGuiListClipperRange *pIVar5;
  
  pIVar5 = this->Data;
  lVar4 = (long)it - (long)pIVar5;
  iVar3 = this->Size;
  if (iVar3 == this->Capacity) {
    if (iVar3 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar3 / 2 + iVar3;
    }
    new_capacity = iVar3 + 1;
    if (iVar3 + 1 < iVar1) {
      new_capacity = iVar1;
    }
    reserve(this,new_capacity);
    iVar3 = this->Size;
    pIVar5 = this->Data;
  }
  lVar2 = (long)iVar3 - lVar4 / 0xc;
  if (lVar2 != 0 && lVar4 / 0xc <= (long)iVar3) {
    memmove((void *)((long)pIVar5 + lVar4 + 0xc),(void *)((long)pIVar5 + lVar4),lVar2 * 0xc);
    pIVar5 = this->Data;
  }
  *(undefined4 *)((long)pIVar5 + lVar4 + 8) = *(undefined4 *)&v->PosToIndexConvert;
  *(undefined8 *)((long)pIVar5 + lVar4) = *(undefined8 *)v;
  this->Size = this->Size + 1;
  return (ImGuiListClipperRange *)(lVar4 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }